

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

bool duckdb::TryCastDecimalToNumeric<int,unsigned_char>
               (int input,uchar *result,CastParameters *parameters,uint8_t scale)

{
  bool bVar1;
  byte in_CL;
  int in_EDI;
  string error;
  int64_t scaled_value;
  int64_t rounding;
  int64_t fNegate;
  int64_t power;
  uint8_t *in_stack_ffffffffffffff58;
  CastParameters *parameters_00;
  undefined8 in_stack_ffffffffffffff60;
  int32_t input_00;
  string *error_message;
  string *in_stack_ffffffffffffff68;
  undefined1 local_81 [33];
  string local_60 [32];
  CastParameters *local_40;
  long local_38;
  ulong local_30;
  ulong local_28;
  byte local_1;
  
  input_00 = (int32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_28 = *(ulong *)(NumericHelper::POWERS_OF_TEN + (ulong)in_CL * 8);
  local_30 = (ulong)(in_EDI < 0);
  local_38 = (long)((local_28 ^ -local_30) + local_30) / 2;
  local_40 = (CastParameters *)((in_EDI + local_38) / (long)local_28);
  UnsafeNumericCast<int,long,void>((long)local_40);
  bVar1 = TryCast::Operation<int,unsigned_char>(input_00,in_stack_ffffffffffffff58,false);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    error_message = (string *)local_81;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_81 + 1),"Failed to cast decimal value %d to type %s",
               (allocator *)error_message);
    parameters_00 = local_40;
    GetTypeId<unsigned_char>();
    StringUtil::Format<long,duckdb::PhysicalType>
              (in_stack_ffffffffffffff68,(long)error_message,
               (PhysicalType)((ulong)parameters_00 >> 0x38));
    ::std::__cxx11::string::~string((string *)(local_81 + 1));
    ::std::allocator<char>::~allocator((allocator<char> *)local_81);
    HandleCastError::AssignError(error_message,parameters_00);
    local_1 = 0;
    ::std::__cxx11::string::~string(local_60);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool TryCastDecimalToNumeric(SRC input, DST &result, CastParameters &parameters, uint8_t scale) {
	// Round away from 0.
	const auto power = NumericHelper::POWERS_OF_TEN[scale];
	// https://graphics.stanford.edu/~seander/bithacks.html#ConditionalNegate
	const auto fNegate = int64_t(input < 0);
	const auto rounding = ((power ^ -fNegate) + fNegate) / 2;
	const auto scaled_value = (input + rounding) / power;
	if (!TryCast::Operation<SRC, DST>(UnsafeNumericCast<SRC>(scaled_value), result)) {
		string error = StringUtil::Format("Failed to cast decimal value %d to type %s", scaled_value, GetTypeId<DST>());
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	return true;
}